

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslParseHelper.cpp
# Opt level: O0

TIntermTyped * __thiscall
glslang::HlslParseContext::convertArray(HlslParseContext *this,TIntermTyped *node,TType *type)

{
  TIntermediate *pTVar1;
  bool bVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  TBasicType t;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TIntermConstantUnion *index;
  undefined4 extraout_var_03;
  TIntermTyped *pTVar6;
  TType *local_280;
  byte local_261;
  int local_25c;
  TIntermAggregate *pTStack_258;
  int c;
  TIntermAggregate *elementConstructee;
  TIntermTyped *elementArg;
  undefined1 local_240 [4];
  int e;
  TType crossType;
  TOperator componentOp;
  TType *componentType;
  TType speculativeComponentType;
  TType derefType;
  TIntermAggregate *constructor;
  anon_class_40_5_95b64da4 getNextComponent;
  int constructeeComponent;
  int constructeeElement;
  TIntermTyped *constructee;
  TType *type_local;
  TIntermTyped *node_local;
  HlslParseContext *this_local;
  
  constructee = (TIntermTyped *)type;
  type_local = (TType *)node;
  node_local = (TIntermTyped *)this;
  uVar3 = (*(node->super_TIntermNode)._vptr_TIntermNode[0x2a])();
  local_261 = 0;
  if ((uVar3 & 1) != 0) {
    iVar4 = (*(constructee->super_TIntermNode)._vptr_TIntermNode[0x1d])();
    local_261 = (byte)iVar4;
  }
  if ((local_261 & 1) == 0) {
    __assert_fail("node->isArray() && type.isArray()",
                  "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/glslang/HLSL/hlslParseHelper.cpp"
                  ,0x21f3,
                  "TIntermTyped *glslang::HlslParseContext::convertArray(TIntermTyped *, const TType &)"
                 );
  }
  iVar4 = (*type_local->_vptr_TType[0x1e])();
  iVar4 = TType::computeNumComponents((TType *)CONCAT44(extraout_var,iVar4));
  iVar5 = TType::computeNumComponents((TType *)constructee);
  if (iVar4 < iVar5) {
    this_local = (HlslParseContext *)0x0;
  }
  else {
    iVar4 = (*type_local->_vptr_TType[3])();
    _constructeeComponent = (TIntermTyped *)CONCAT44(extraout_var_00,iVar4);
    getNextComponent.constructeeComponent._4_4_ = 0;
    getNextComponent.constructeeComponent._0_4_ = 0;
    getNextComponent.this = (HlslParseContext *)&type_local;
    getNextComponent.node = (TIntermTyped **)&constructeeComponent;
    getNextComponent.constructee =
         (TIntermTyped **)((long)&getNextComponent.constructeeComponent + 4);
    getNextComponent.constructeeElement = (int *)&getNextComponent.constructeeComponent;
    derefType.spirvType = (TSpirvType *)0x0;
    constructor = (TIntermAggregate *)this;
    TType::TType((TType *)&speculativeComponentType.spirvType,(TType *)constructee,0,false);
    TType::TType((TType *)&componentType,(TType *)&speculativeComponentType.spirvType,0,false);
    bVar2 = TType::isVector((TType *)&speculativeComponentType.spirvType);
    if (bVar2) {
      local_280 = (TType *)&componentType;
    }
    else {
      local_280 = (TType *)&speculativeComponentType.spirvType;
    }
    crossType.spirvType._4_4_ =
         TIntermediate::mapTypeToConstructorOp
                   ((this->super_TParseContextBase).super_TParseVersions.intermediate,local_280);
    t = (*type_local->_vptr_TType[0x20])();
    iVar4 = (*(constructee->super_TIntermNode)._vptr_TIntermNode[0xc])();
    TType::TType((TType *)local_240,t,EvqTemporary,iVar4,0,0,false);
    for (elementArg._4_4_ = 0; iVar4 = (*(constructee->super_TIntermNode)._vptr_TIntermNode[0xf])(),
        elementArg._4_4_ < iVar4; elementArg._4_4_ = elementArg._4_4_ + 1) {
      iVar4 = (*(constructee->super_TIntermNode)._vptr_TIntermNode[0xc])();
      iVar5 = (*(_constructeeComponent->super_TIntermNode)._vptr_TIntermNode[0x26])();
      if (iVar4 == iVar5) {
        iVar4 = (**type_local->_vptr_TType)();
        pTVar6 = _constructeeComponent;
        pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
        iVar5 = (**type_local->_vptr_TType)();
        index = TIntermediate::addConstantUnion
                          (pTVar1,elementArg._4_4_,(TSourceLoc *)CONCAT44(extraout_var_02,iVar5),
                           false);
        elementConstructee =
             (TIntermAggregate *)
             handleBracketDereference
                       (this,(TSourceLoc *)CONCAT44(extraout_var_01,iVar4),pTVar6,
                        &index->super_TIntermTyped);
      }
      else {
        iVar4 = (*(constructee->super_TIntermNode)._vptr_TIntermNode[0xc])();
        if (iVar4 == 1) {
          elementConstructee =
               (TIntermAggregate *)
               convertArray::anon_class_40_5_95b64da4::operator()
                         ((anon_class_40_5_95b64da4 *)&constructor);
        }
        else {
          pTStack_258 = (TIntermAggregate *)0x0;
          for (local_25c = 0; iVar4 = (*(constructee->super_TIntermNode)._vptr_TIntermNode[0xc])(),
              local_25c < iVar4; local_25c = local_25c + 1) {
            pTVar1 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
            pTVar6 = convertArray::anon_class_40_5_95b64da4::operator()
                               ((anon_class_40_5_95b64da4 *)&constructor);
            pTStack_258 = TIntermediate::growAggregate
                                    (pTVar1,(TIntermNode *)pTStack_258,&pTVar6->super_TIntermNode);
          }
          iVar4 = (**type_local->_vptr_TType)();
          elementConstructee =
               (TIntermAggregate *)
               addConstructor(this,(TSourceLoc *)CONCAT44(extraout_var_03,iVar4),
                              (TIntermTyped *)pTStack_258,(TType *)local_240);
        }
      }
      pTVar6 = TIntermediate::addConversion
                         ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                          crossType.spirvType._4_4_,(TType *)&speculativeComponentType.spirvType,
                          (TIntermTyped *)elementConstructee);
      if (pTVar6 == (TIntermTyped *)0x0) {
        this_local = (HlslParseContext *)0x0;
        goto LAB_0064aa69;
      }
      derefType.spirvType =
           (TSpirvType *)
           TIntermediate::growAggregate
                     ((this->super_TParseContextBase).super_TParseVersions.intermediate,
                      (TIntermNode *)derefType.spirvType,&pTVar6->super_TIntermNode);
    }
    this_local = (HlslParseContext *)derefType.spirvType;
LAB_0064aa69:
    TType::~TType((TType *)local_240);
    TType::~TType((TType *)&componentType);
    TType::~TType((TType *)&speculativeComponentType.spirvType);
  }
  return (TIntermTyped *)this_local;
}

Assistant:

TIntermTyped* HlslParseContext::convertArray(TIntermTyped* node, const TType& type)
{
    assert(node->isArray() && type.isArray());
    if (node->getType().computeNumComponents() < type.computeNumComponents())
        return nullptr;

    // TODO: write an argument replicator, for the case the argument should not be
    // executed multiple times, yet multiple copies are needed.

    TIntermTyped* constructee = node->getAsTyped();
    // track where we are in consuming the argument
    int constructeeElement = 0;
    int constructeeComponent = 0;

    // bump up to the next component to consume
    const auto getNextComponent = [&]() {
        TIntermTyped* component;
        component = handleBracketDereference(node->getLoc(), constructee,
                                             intermediate.addConstantUnion(constructeeElement, node->getLoc()));
        if (component->isVector())
            component = handleBracketDereference(node->getLoc(), component,
                                                 intermediate.addConstantUnion(constructeeComponent, node->getLoc()));
        // bump component pointer up
        ++constructeeComponent;
        if (constructeeComponent == constructee->getVectorSize()) {
            constructeeComponent = 0;
            ++constructeeElement;
        }
        return component;
    };

    // make one subnode per constructed array element
    TIntermAggregate* constructor = nullptr;
    TType derefType(type, 0);
    TType speculativeComponentType(derefType, 0);
    TType* componentType = derefType.isVector() ? &speculativeComponentType : &derefType;
    TOperator componentOp = intermediate.mapTypeToConstructorOp(*componentType);
    TType crossType(node->getBasicType(), EvqTemporary, type.getVectorSize());
    for (int e = 0; e < type.getOuterArraySize(); ++e) {
        // construct an element
        TIntermTyped* elementArg;
        if (type.getVectorSize() == constructee->getVectorSize()) {
            // same element shape
            elementArg = handleBracketDereference(node->getLoc(), constructee,
                                                  intermediate.addConstantUnion(e, node->getLoc()));
        } else {
            // mismatched element shapes
            if (type.getVectorSize() == 1)
                elementArg = getNextComponent();
            else {
                // make a vector
                TIntermAggregate* elementConstructee = nullptr;
                for (int c = 0; c < type.getVectorSize(); ++c)
                    elementConstructee = intermediate.growAggregate(elementConstructee, getNextComponent());
                elementArg = addConstructor(node->getLoc(), elementConstructee, crossType);
            }
        }
        // convert basic types
        elementArg = intermediate.addConversion(componentOp, derefType, elementArg);
        if (elementArg == nullptr)
            return nullptr;
        // combine with top-level constructor
        constructor = intermediate.growAggregate(constructor, elementArg);
    }

    return constructor;
}